

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::IfcSimpleProperty(IfcSimpleProperty *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcProperty::IfcProperty(&this->super_IfcProperty,vtt + 1);
  pvVar1 = vtt[5];
  *(void **)&(this->super_IfcProperty).field_0x58 = pvVar1;
  *(void **)(&(this->super_IfcProperty).field_0x58 + *(long *)((long)pvVar1 + -0x18)) = vtt[6];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcProperty).field_0x58 = vtt[8];
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}